

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureBufferDataStoreQueryCase::iterate
          (TextureBufferDataStoreQueryCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  bool bVar4;
  ContextType ctxType;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  undefined8 *puVar7;
  long *plVar8;
  NotSupportedError *this_00;
  size_type *psVar9;
  ulong uVar10;
  undefined8 uVar11;
  GLuint texture;
  GLuint buffer;
  CallLogWrapper gl;
  ScopedLogSection section;
  ResultCollector result;
  long *local_158;
  undefined8 local_150;
  long local_148;
  undefined8 uStack_140;
  string local_138;
  GLuint local_114;
  string local_110;
  string local_f0;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  GLuint local_ac;
  CallLogWrapper local_a8;
  ScopedLogSection local_90;
  code *local_88;
  GLenum local_80;
  ResultCollector local_78;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar4) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
    if (!bVar4) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_texture_buffer is not supported",
                 "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
                 ,0x157);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_a8,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_78,pTVar3,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_a8.m_enableLog = true;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"NonBuffer","");
  paVar2 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Non-buffer","");
  tcu::ScopedLogSection::ScopedLogSection(&local_90,pTVar3,&local_138,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGenTextures(&local_a8,1,&local_114);
  glu::CallLogWrapper::glBindTexture(&local_a8,0xde1,local_114);
  glu::CallLogWrapper::glTexStorage2D(&local_a8,0xde1,1,0x8058,0x20,0x20);
  GVar6 = glu::CallLogWrapper::glGetError(&local_a8);
  if (GVar6 != 0) {
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Got Error ","");
    local_88 = glu::getErrorName;
    local_80 = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f0,&local_88);
    uVar10 = 0xf;
    if (local_d0 != local_c0) {
      uVar10 = local_c0[0];
    }
    if (uVar10 < local_f0._M_string_length + local_c8) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar11 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_f0._M_string_length + local_c8) goto LAB_00603a7d;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_00603a7d:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
    }
    local_158 = &local_148;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_148 = *plVar8;
      uStack_140 = puVar7[3];
    }
    else {
      local_148 = *plVar8;
      local_158 = (long *)*puVar7;
    }
    local_150 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_158);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138.field_2._8_8_ = plVar8[3];
      local_138._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_138._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_78,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
  }
  gls::StateQueryUtil::verifyStateTextureLevelInteger
            (&local_78,&local_a8,0xde1,0,0x8c2d,0,this->m_type);
  glu::CallLogWrapper::glDeleteTextures(&local_a8,1,&local_114);
  tcu::TestLog::endSection(local_90.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Buffer","");
  local_110._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Texture buffer","");
  tcu::ScopedLogSection::ScopedLogSection(&local_90,pTVar3,&local_138,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGenTextures(&local_a8,1,&local_114);
  glu::CallLogWrapper::glBindTexture(&local_a8,0x8c2a,local_114);
  GVar6 = glu::CallLogWrapper::glGetError(&local_a8);
  if (GVar6 != 0) {
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Got Error ","");
    local_88 = glu::getErrorName;
    local_80 = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f0,&local_88);
    uVar10 = 0xf;
    if (local_d0 != local_c0) {
      uVar10 = local_c0[0];
    }
    if (uVar10 < local_f0._M_string_length + local_c8) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar11 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_f0._M_string_length + local_c8) goto LAB_00603dd5;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_00603dd5:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
    }
    local_158 = &local_148;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_148 = *plVar8;
      uStack_140 = puVar7[3];
    }
    else {
      local_148 = *plVar8;
      local_158 = (long *)*puVar7;
    }
    local_150 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_158);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138.field_2._8_8_ = plVar8[3];
      local_138._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_138._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_78,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
  }
  glu::CallLogWrapper::glGenBuffers(&local_a8,1,&local_ac);
  glu::CallLogWrapper::glBindBuffer(&local_a8,0x8c2a,local_ac);
  glu::CallLogWrapper::glBufferData(&local_a8,0x8c2a,0x20,(void *)0x0,0x88e4);
  GVar6 = glu::CallLogWrapper::glGetError(&local_a8);
  if (GVar6 != 0) {
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Got Error ","");
    local_88 = glu::getErrorName;
    local_80 = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f0,&local_88);
    uVar10 = 0xf;
    if (local_d0 != local_c0) {
      uVar10 = local_c0[0];
    }
    if (uVar10 < local_f0._M_string_length + local_c8) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar11 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_f0._M_string_length + local_c8) goto LAB_0060407d;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_0060407d:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
    }
    local_158 = &local_148;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_148 = *plVar8;
      uStack_140 = puVar7[3];
    }
    else {
      local_148 = *plVar8;
      local_158 = (long *)*puVar7;
    }
    local_150 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_158);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138.field_2._8_8_ = plVar8[3];
      local_138._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_138._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_78,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
  }
  glu::CallLogWrapper::glTexBuffer(&local_a8,0x8c2a,0x8236,local_ac);
  GVar6 = glu::CallLogWrapper::glGetError(&local_a8);
  if (GVar6 == 0) goto LAB_00604493;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Got Error ","");
  local_88 = glu::getErrorName;
  local_80 = GVar6;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f0,&local_88);
  uVar10 = 0xf;
  if (local_d0 != local_c0) {
    uVar10 = local_c0[0];
  }
  if (uVar10 < local_f0._M_string_length + local_c8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar11 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_f0._M_string_length + local_c8) goto LAB_006042f1;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_006042f1:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
  }
  local_158 = &local_148;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_148 = *plVar8;
    uStack_140 = puVar7[3];
  }
  else {
    local_148 = *plVar8;
    local_158 = (long *)*puVar7;
  }
  local_150 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_158);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_110.field_2._M_allocated_capacity = *psVar9;
    local_110.field_2._8_8_ = plVar8[3];
    local_110._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar9;
    local_110._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_110._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_138.field_2._M_allocated_capacity = *psVar9;
    local_138.field_2._8_8_ = plVar8[3];
    local_138._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar9;
    local_138._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_138._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::ResultCollector::fail(&local_78,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
LAB_00604493:
  gls::StateQueryUtil::verifyStateTextureLevelInteger
            (&local_78,&local_a8,0x8c2a,0,0x8c2d,local_ac,this->m_type);
  glu::CallLogWrapper::glDeleteTextures(&local_a8,1,&local_114);
  glu::CallLogWrapper::glDeleteBuffers(&local_a8,1,&local_ac);
  tcu::TestLog::endSection(local_90.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_78,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_message._M_dataplus._M_p != &local_78.m_message.field_2) {
    operator_delete(local_78.m_message._M_dataplus._M_p,
                    local_78.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_prefix._M_dataplus._M_p != &local_78.m_prefix.field_2) {
    operator_delete(local_78.m_prefix._M_dataplus._M_p,
                    local_78.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_a8);
  return STOP;
}

Assistant:

TextureBufferDataStoreQueryCase::IterateResult TextureBufferDataStoreQueryCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	TCU_CHECK_AND_THROW(NotSupportedError, supportsES32 || m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"), "GL_EXT_texture_buffer is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// non-buffer
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "NonBuffer", "Non-buffer");

		glw::GLuint	texture;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(GL_TEXTURE_2D, texture);
		gl.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 32, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "gen texture");

		verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_2D, 0, GL_TEXTURE_BUFFER_DATA_STORE_BINDING, 0, m_type);

		gl.glDeleteTextures(1, &texture);
	}

	// buffer
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Buffer", "Texture buffer");

		glw::GLuint	texture;
		glw::GLuint	buffer;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(GL_TEXTURE_BUFFER, texture);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind texture");

		gl.glGenBuffers(1, &buffer);
		gl.glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		gl.glBufferData(GL_TEXTURE_BUFFER, 32, DE_NULL, GL_STATIC_DRAW);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind buf");

		gl.glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "tex buffer");

		verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_BUFFER, 0, GL_TEXTURE_BUFFER_DATA_STORE_BINDING, buffer, m_type);

		gl.glDeleteTextures(1, &texture);
		gl.glDeleteBuffers(1, &buffer);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}